

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_3,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  int col_1;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  Vector<float,_3> *pVVar7;
  int col;
  float v;
  float fVar8;
  undefined4 uVar9;
  Type in0;
  Vector<float,_4> res;
  float local_58 [4];
  Type in1;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in0.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in0.m_data[0] = 1.1;
    in0.m_data[1] = 0.1;
    in0.m_data[2] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&in1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar9;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in1.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in1.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    in1.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in1.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    in1.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    in1.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
  }
  else {
    pVVar2 = (Vector<float,_3> *)&in1;
    in1.m_data.m_data[2].m_data[2] = 0.0;
    in1.m_data.m_data[3].m_data[0] = 0.0;
    in1.m_data.m_data[3].m_data[1] = 0.0;
    in1.m_data.m_data[3].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[2] = 0.0;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &DAT_01bf4660;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar7 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar7->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar5 != 4);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  pVVar2 = (Vector<float,_3> *)&in1;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar5 = 0;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_4> *)pVVar2->m_data)->m_data[0].m_data[lVar5]
                      * in0.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    res.m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pVVar2 = pVVar2 + 1;
  } while (lVar3 != 4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = res.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}